

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O3

void __thiscall
data_structures::LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
~LinkedList(LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this)

{
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar1;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar2;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar3;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *temp_node;
  
  this->_vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010cc68;
  pLVar2 = this->_tail;
  pLVar3 = this->_header;
  while (pLVar3 != pLVar2) {
    pLVar1 = pLVar3->_next;
    if (pLVar1 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
      pLVar3->_next = pLVar1->_next;
      (*pLVar1->_vptr_ListNode[1])(pLVar1);
      pLVar2 = this->_tail;
    }
    if (pLVar1 == pLVar2) {
      this->_tail = pLVar3;
      pLVar2 = pLVar3;
    }
    this->_size = this->_size - 1;
    pLVar3 = this->_header;
  }
  if (pLVar3 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
    (*pLVar3->_vptr_ListNode[1])(pLVar3);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

inline
    LinkedList<T>::~LinkedList(){
        while (!isEmpty()) {
            deleteFromHeader();
        }
        delete _header;
        _header = 0;
        _tail = 0;
        _size = 0;
    }